

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.c
# Opt level: O1

void layout_menu(gamewin *gw)

{
  int iVar1;
  uint uVar2;
  gamewin *__s;
  _func_void_gamewin_ptr *p_Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  _func_void_gamewin_ptr *p_Var14;
  ulong uVar15;
  _func_void_gamewin_ptr *__s_00;
  wchar_t colwidth [16];
  int local_98;
  int local_78 [18];
  
  iVar11 = *(int *)((long)&gw[4].resize + 4);
  if (iVar11 < 1) {
    iVar11 = 0;
  }
  local_98 = 0;
  iVar9 = *(int *)&gw[4].win;
  if (*(int *)&gw[4].win < 1) {
    iVar9 = 0;
  }
  iVar6 = *(int *)((long)&gw[4].win + 4);
  iVar4 = _COLS;
  if (iVar6 < _COLS) {
    iVar4 = iVar6;
  }
  if (iVar6 < 1) {
    iVar4 = _COLS;
  }
  iVar6 = *(int *)&gw[4].next;
  iVar5 = _LINES;
  if (iVar6 < _LINES) {
    iVar5 = iVar6;
  }
  if (iVar6 < 1) {
    iVar5 = _LINES;
  }
  *(undefined4 *)&gw[2].resize = 2;
  __s = gw[1].next;
  if ((__s != (gamewin *)0x0) && (*(char *)&__s->draw != '\0')) {
    *(undefined4 *)&gw[2].resize = 4;
  }
  iVar6 = *(int *)&gw[2].resize;
  iVar1 = *(int *)&gw[1].prev;
  iVar10 = 0x34;
  if (iVar1 < 0x34) {
    iVar10 = iVar1;
  }
  iVar10 = iVar10 + iVar6;
  if (iVar5 - iVar9 <= iVar10) {
    iVar10 = iVar5 - iVar9;
  }
  *(int *)((long)&gw[2].draw + 4) = iVar10;
  *(int *)((long)&gw[2].resize + 4) = iVar10 - iVar6;
  *(undefined4 *)&gw[4].resize = 0;
  local_78[0xc] = 0;
  local_78[0xd] = 0;
  local_78[0xe] = 0;
  local_78[0xf] = 0;
  local_78[8] = 0;
  local_78[9] = 0;
  local_78[10] = 0;
  local_78[0xb] = 0;
  local_78[4] = 0;
  local_78[5] = 0;
  local_78[6] = 0;
  local_78[7] = 0;
  local_78[0] = 0;
  local_78[1] = 0;
  local_78[2] = 0;
  local_78[3] = 0;
  if (0 < (long)iVar1) {
    p_Var3 = gw[1].resize;
    lVar13 = 0;
    local_98 = 0;
    do {
      __s_00 = p_Var3 + lVar13 * 0x10c + 8;
      pcVar7 = strchr((char *)__s_00,9);
      if (pcVar7 == (char *)0x0) {
        p_Var14 = p_Var3 + lVar13 * 0x10c;
        sVar8 = strlen((char *)__s_00);
        iVar6 = (int)sVar8;
        iVar9 = iVar6;
        if ((*(int *)(p_Var14 + 4) == 1) && (iVar9 = iVar6 + 4, *(int *)p_Var14 == 0)) {
          iVar9 = iVar6;
        }
        if (iVar9 < local_98) {
          iVar9 = local_98;
        }
      }
      else {
        uVar12 = 0;
        do {
          iVar9 = (int)((long)pcVar7 - (long)__s_00);
          if ((long)pcVar7 - (long)__s_00 < (long)local_78[uVar12]) {
            iVar9 = local_78[uVar12];
          }
          local_78[uVar12] = iVar9;
          __s_00 = (_func_void_gamewin_ptr *)(pcVar7 + 1);
          uVar15 = uVar12 + 1;
          pcVar7 = strchr((char *)__s_00,9);
        } while ((uVar12 < 0xf) && (uVar12 = uVar15, pcVar7 != (char *)0x0));
        iVar9 = local_78[uVar15];
        sVar8 = strlen((char *)__s_00);
        iVar6 = (int)sVar8;
        if (sVar8 < (ulong)(long)iVar9) {
          iVar6 = iVar9;
        }
        local_78[uVar15] = iVar6;
        iVar9 = (int)uVar15;
        if ((int)uVar15 < *(int *)&gw[4].resize) {
          iVar9 = *(int *)&gw[4].resize;
        }
        *(int *)&gw[4].resize = iVar9;
        iVar9 = local_98;
      }
      local_98 = iVar9;
      lVar13 = lVar13 + 1;
    } while (lVar13 != iVar1);
  }
  if (*(int *)((long)&gw[1].prev + 4) != 0) {
    local_78[0] = local_78[0] + 4;
  }
  uVar2 = *(uint *)&gw[4].resize;
  if (0 < (int)uVar2) {
    iVar9 = *(int *)&gw[2].next;
    uVar12 = 0;
    do {
      iVar9 = iVar9 + local_78[uVar12] + 1;
      *(int *)((long)&gw[2].next + uVar12 * 4 + 4) = iVar9;
      uVar12 = uVar12 + 1;
    } while (uVar2 != uVar12);
  }
  if (local_98 < local_78[(int)uVar2] + *(int *)((long)&gw[2].next + (long)(int)uVar2 * 4)) {
    uVar2 = *(uint *)&gw[4].resize;
    if (0 < (int)uVar2) {
      iVar9 = *(int *)&gw[2].next;
      uVar12 = 0;
      do {
        iVar9 = iVar9 + local_78[uVar12] + 1;
        *(int *)((long)&gw[2].next + uVar12 * 4 + 4) = iVar9;
        uVar12 = uVar12 + 1;
      } while (uVar2 != uVar12);
    }
    local_98 = local_78[(int)uVar2] + *(int *)((long)&gw[2].next + (long)(int)uVar2 * 4);
  }
  iVar11 = (iVar4 - iVar11) + -4;
  if (local_98 < iVar11) {
    iVar11 = local_98;
  }
  *(int *)((long)&gw[2].win + 4) = iVar11;
  *(int *)&gw[2].win = iVar11 + 4;
  *(int *)((long)&gw[2].next + (long)*(int *)&gw[4].resize * 4 + 4) = iVar11 + 1;
  if ((__s != (gamewin *)0x0) &&
     (iVar11 = *(int *)&gw[2].win, sVar8 = strlen((char *)__s), (ulong)(long)iVar11 < sVar8 + 4)) {
    *(int *)((long)&gw[2].win + 4) = (int)sVar8;
    *(int *)&gw[2].win = (int)sVar8 + 4;
  }
  return;
}

Assistant:

static void layout_menu(struct gamewin *gw)
{
    struct win_menu *mdat = (struct win_menu*)gw->extra;
    int i, col, w, x1, x2, y1, y2;
    int colwidth[MAXCOLS];
    int scrheight;
    int scrwidth;
    int singlewidth = 0;
    
    x1 = (mdat->x1 > 0) ? mdat->x1 : 0;
    y1 = (mdat->y1 > 0) ? mdat->y1 : 0;
    x2 = (mdat->x2 > 0 && mdat->x2 <= COLS) ? mdat->x2 : COLS;
    y2 = (mdat->y2 > 0 && mdat->y2 <= LINES) ? mdat->y2 : LINES;
    
    scrheight = y2 - y1;
    scrwidth = x2 - x1;
    
    /* calc height */
    mdat->frameheight = 2;
    if (mdat->title && mdat->title[0]) {
	mdat->frameheight += 2; /* window title + space */
    }
	
    mdat->height = mdat->frameheight + min(mdat->icount, 52);
    if (mdat->height > scrheight)
	mdat->height = scrheight;
    mdat->innerheight = mdat->height - mdat->frameheight;
    
    /* calc width */
    mdat->maxcol = 0;
    for (i = 0; i < MAXCOLS; i++)
	colwidth[i] = 0;
    
    for (i = 0; i < mdat->icount; i++) {
	/* headings without tabs are not fitted into columns, but headers with
	 * tabs are presumably column titles */
	if (!strchr(mdat->items[i].caption, '\t')) {
	    w = strlen(mdat->items[i].caption);
	    if (mdat->items[i].role == MI_NORMAL && mdat->items[i].id)
		w += 4;
	    singlewidth = max(singlewidth, w);
	} else {
	    col = calc_colwidths(mdat->items[i].caption, colwidth);
	    mdat->maxcol = max(mdat->maxcol, col);
	}
    }
    if (mdat->how != PICK_NONE)
	colwidth[0] += 4; /* "a - " */
    
    mdat->innerwidth = max(calc_menuwidth(colwidth, mdat->colpos, mdat->maxcol),
			   singlewidth);
    if (mdat->innerwidth > scrwidth - 4)/* make sure there is space for window borders */
	mdat->innerwidth = scrwidth - 4;
    mdat->width = mdat->innerwidth + 4; /* border + space */
    mdat->colpos[mdat->maxcol+1] = mdat->innerwidth+1;
    
    if (mdat->title && mdat->width < strlen(mdat->title) + 4) {
	mdat->innerwidth = strlen(mdat->title);
	mdat->width = mdat->innerwidth + 4;
    }
}